

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O0

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float *ptr_5;
  int j_5;
  int i_5;
  float *outptr_5;
  int q_4;
  int j_4;
  float *ptr_4;
  int i_4;
  float *outptr_4;
  int q_3;
  float *ptr_3;
  int j_3;
  int i_3;
  float *outptr_3;
  int q_2;
  int j_2;
  float *ptr_2;
  int i_2;
  float *outptr_2;
  int q_1;
  int j_1;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  int j;
  int i;
  float *outptr;
  float *ptr;
  int dims;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffbd0;
  Mat *in_stack_fffffffffffffbd8;
  Mat *pMVar3;
  size_t in_stack_fffffffffffffbe0;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffffbe8;
  int _w;
  Mat *in_stack_fffffffffffffbf0;
  Mat local_390;
  Mat *local_350;
  int local_348;
  int local_344;
  Mat local_340;
  float *local_300;
  int local_2f8;
  int local_2f4;
  Mat local_2f0;
  float *local_2b0;
  int local_2a4;
  Mat local_2a0;
  float *local_260;
  int local_254;
  Mat local_250;
  float *local_210;
  int local_208;
  int local_204;
  Mat local_200;
  float *local_1c0;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_170;
  int local_164;
  Mat local_160;
  float *local_120;
  int local_114;
  int local_110;
  int local_10c;
  Mat local_108;
  float *local_c8;
  Mat local_b0;
  float *local_70;
  int local_64;
  int local_60;
  int local_5c;
  float *local_50;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  local_44 = in_RSI->dims;
  _h = (int)in_stack_fffffffffffffbe8;
  _w = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  if (local_44 == 2) {
    if (*(int *)(in_RDI + 0xb8) == 0) {
      Mat::operator=(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    }
    else if (*(int *)(in_RDI + 0xb8) == 1) {
      local_20 = in_RDX;
      local_18 = in_RSI;
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,in_stack_fffffffffffffbe0,
                  (Allocator *)in_stack_fffffffffffffbd8);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      local_50 = Mat::operator_cast_to_float_(local_18);
      pfVar2 = Mat::operator_cast_to_float_(local_20);
      for (local_5c = 0; local_5c < local_2c; local_5c = local_5c + 1) {
        for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
          pfVar2[local_5c * local_30 + local_60] = local_50[local_60 * local_2c + local_5c];
        }
      }
    }
  }
  else if (*(int *)(in_RDI + 0xb8) == 0) {
    Mat::operator=(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  }
  else {
    _c = (int)(in_stack_fffffffffffffbe0 >> 0x20);
    if (*(int *)(in_RDI + 0xb8) == 1) {
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,_c,(size_t)in_stack_fffffffffffffbd8,
                  (Allocator *)in_stack_fffffffffffffbd0);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      for (local_64 = 0; local_64 < local_34; local_64 = local_64 + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_b0);
        Mat::~Mat((Mat *)0x1aed32);
        local_70 = pfVar2;
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_108);
        Mat::~Mat((Mat *)0x1aed8a);
        for (local_10c = 0; local_10c < local_2c; local_10c = local_10c + 1) {
          for (local_110 = 0; local_110 < local_30; local_110 = local_110 + 1) {
            pfVar2[local_10c * local_30 + local_110] = local_70[local_110 * local_2c + local_10c];
          }
        }
        local_c8 = pfVar2;
      }
    }
    else if (*(int *)(in_RDI + 0xb8) == 2) {
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,_c,(size_t)in_stack_fffffffffffffbd8,
                  (Allocator *)in_stack_fffffffffffffbd0);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      for (local_114 = 0; local_114 < local_30; local_114 = local_114 + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_160);
        Mat::~Mat((Mat *)0x1aef84);
        local_120 = pfVar2;
        for (local_164 = 0; local_164 < local_34; local_164 = local_164 + 1) {
          Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          pfVar2 = Mat::row(&local_1b0,local_114);
          Mat::~Mat((Mat *)0x1aeff6);
          for (local_1b4 = 0; local_1b4 < local_2c; local_1b4 = local_1b4 + 1) {
            local_120[local_164 * local_2c + local_1b4] = pfVar2[local_1b4];
          }
          local_170 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xb8) == 3) {
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,_c,(size_t)in_stack_fffffffffffffbd8,
                  (Allocator *)in_stack_fffffffffffffbd0);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      for (local_1b8 = 0; local_1b8 < local_30; local_1b8 = local_1b8 + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_200);
        Mat::~Mat((Mat *)0x1af1bd);
        local_1c0 = pfVar2;
        for (local_204 = 0; local_204 < local_2c; local_204 = local_204 + 1) {
          for (local_208 = 0; local_208 < local_34; local_208 = local_208 + 1) {
            Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            pfVar2 = Mat::row(&local_250,local_1b8);
            Mat::~Mat((Mat *)0x1af24e);
            local_1c0[local_204 * local_34 + local_208] = pfVar2[local_204];
            local_210 = pfVar2;
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0xb8) == 4) {
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,_c,(size_t)in_stack_fffffffffffffbd8,
                  (Allocator *)in_stack_fffffffffffffbd0);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      for (local_254 = 0; local_254 < local_2c; local_254 = local_254 + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2a0);
        Mat::~Mat((Mat *)0x1af3f9);
        local_260 = pfVar2;
        for (local_2a4 = 0; local_2a4 < local_34; local_2a4 = local_2a4 + 1) {
          pMVar3 = &local_2f0;
          Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(pMVar3);
          Mat::~Mat((Mat *)0x1af464);
          for (local_2f4 = 0; local_2f4 < local_30; local_2f4 = local_2f4 + 1) {
            local_260[local_2a4 * local_30 + local_2f4] = pfVar2[local_2f4 * local_2c + local_254];
          }
          local_2b0 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xb8) == 5) {
      Mat::create(in_stack_fffffffffffffbf0,_w,_h,_c,(size_t)in_stack_fffffffffffffbd8,
                  (Allocator *)in_stack_fffffffffffffbd0);
      bVar1 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar1) {
        return -100;
      }
      for (local_2f8 = 0; local_2f8 < local_2c; local_2f8 = local_2f8 + 1) {
        pMVar3 = &local_340;
        Mat::channel(pMVar3,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(pMVar3);
        Mat::~Mat((Mat *)0x1af63c);
        local_300 = pfVar2;
        for (local_344 = 0; local_344 < local_30; local_344 = local_344 + 1) {
          for (local_348 = 0; local_348 < local_34; local_348 = local_348 + 1) {
            Mat::channel(pMVar3,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            in_stack_fffffffffffffbd0 = (Mat *)Mat::operator_cast_to_float_(&local_390);
            Mat::~Mat((Mat *)0x1af6c4);
            local_300[local_344 * local_34 + local_348] =
                 *(float *)((long)&in_stack_fffffffffffffbd0->data +
                           (long)(local_344 * local_2c + local_2f8) * 4);
            local_350 = in_stack_fffffffffffffbd0;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int dims = bottom_blob.dims;

    if (dims == 2)
    {
        // order_type
        // 0 = w h
        // 1 = h w

        if (order_type == 0)
        {
            top_blob = bottom_blob;
        }
        else if (order_type == 1)
        {
            top_blob.create(h, w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = top_blob;

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }

        return 0;
    }

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}